

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLChTranscoder.cpp
# Opt level: O1

XMLSize_t __thiscall
xercesc_4_0::XMLChTranscoder::transcodeFrom
          (XMLChTranscoder *this,XMLByte *srcData,XMLSize_t srcCount,XMLCh *toFill,
          XMLSize_t maxChars,XMLSize_t *bytesEaten,uchar *charSizes)

{
  ulong __n;
  
  __n = srcCount >> 1;
  if (maxChars <= srcCount >> 1) {
    __n = maxChars;
  }
  memcpy(toFill,srcData,__n * 2);
  *bytesEaten = __n * 2;
  memset(charSizes,2,__n);
  return __n;
}

Assistant:

XMLSize_t
XMLChTranscoder::transcodeFrom( const   XMLByte* const          srcData
                                , const XMLSize_t               srcCount
                                ,       XMLCh* const            toFill
                                , const XMLSize_t               maxChars
                                ,       XMLSize_t&              bytesEaten
                                ,       unsigned char* const    charSizes)
{
    //
    //  Calculate the max chars we can do here. Its the lesser of the
    //  max output chars and the number of chars in the source.
    //
    const XMLSize_t srcChars = srcCount / sizeof(XMLCh);
    const XMLSize_t countToDo = srcChars < maxChars ? srcChars : maxChars;

    //
    //  Copy over the count of chars that we precalculated. Notice we
    //  convert char count to byte count here!!!
    //
    memcpy(toFill, srcData, countToDo * sizeof(XMLCh));

    // Set the bytes eaten
    bytesEaten = countToDo * sizeof(XMLCh);

    // Set the character sizes to the fixed size
    memset(charSizes, static_cast<int>(sizeof(XMLCh)), countToDo);

    // Return the chars we transcoded
    return countToDo;
}